

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::BasicWriter<wchar_t>::write_str<wchar_t>
          (BasicWriter<wchar_t> *this,StringValue<wchar_t> *s,FormatSpec *spec)

{
  FormatError *this_00;
  wchar_t *in_RDX;
  BasicWriter<wchar_t> *in_RSI;
  CStringRef in_RDI;
  size_t precision;
  char *in_stack_00000028;
  size_t str_size;
  wchar_t *str_value;
  BasicCStringRef<char> local_30;
  AlignSpec *spec_00;
  
  internal::CharTraits<wchar_t>::convert(L'\0');
  if (((char)in_RDX[5] != '\0') && ((char)in_RDX[5] != 's')) {
    internal::report_unknown_type(str_size._7_1_,in_stack_00000028);
  }
  spec_00 = *(AlignSpec **)(in_RSI + 8);
  if ((spec_00 == (AlignSpec *)0x0) && (*(size_t *)in_RSI == 0)) {
    this_00 = (FormatError *)__cxa_allocate_exception(0x10);
    BasicCStringRef<char>::BasicCStringRef(&local_30,"string pointer is null");
    FormatError::FormatError(this_00,in_RDI);
    __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
  }
  if ((L'\xffffffff' < in_RDX[4]) && ((AlignSpec *)(long)in_RDX[4] < spec_00)) {
    spec_00 = (AlignSpec *)(long)in_RDX[4];
  }
  write_str<wchar_t>(in_RSI,in_RDX,*(size_t *)in_RSI,spec_00);
  return;
}

Assistant:

void BasicWriter<Char>::write_str(
    const internal::Arg::StringValue<StrChar> &s, const FormatSpec &spec) {
  // Check if StrChar is convertible to Char.
  internal::CharTraits<Char>::convert(StrChar());
  if (spec.type_ && spec.type_ != 's')
    internal::report_unknown_type(spec.type_, "string");
  const StrChar *str_value = s.value;
  std::size_t str_size = s.size;
  if (str_size == 0) {
    if (!str_value) {
      FMT_THROW(FormatError("string pointer is null"));
    }
  }
  std::size_t precision = static_cast<std::size_t>(spec.precision_);
  if (spec.precision_ >= 0 && precision < str_size)
    str_size = precision;
  write_str(str_value, str_size, spec);
}